

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O1

int Gia_ManSimSimulate(Gia_Man_t *pAig,Gia_ParSim_t *pPars)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Gia_ManSim_t *p;
  Abc_Cex_t *pAVar5;
  uint *puVar6;
  int i;
  uint uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  Gia_ManSim_t *pGVar11;
  Gia_Man_t *pGVar12;
  Gia_Man_t *pAig_00;
  ulong uVar13;
  uint *puVar14;
  uint iFrame;
  long lVar15;
  double dVar16;
  timespec ts;
  timespec local_60;
  int local_50;
  uint local_4c;
  long local_48;
  Gia_Man_t *local_40;
  double local_38;
  
  iVar3 = clock_gettime(3,&local_60);
  if (iVar3 < 0) {
    lVar15 = -1;
  }
  else {
    lVar15 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  iVar3 = pPars->TimeLimit;
  if ((long)iVar3 == 0) {
    lVar8 = 0;
  }
  else {
    iVar4 = clock_gettime(3,&local_60);
    if (iVar4 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    lVar8 = lVar8 + (long)iVar3 * 1000000;
  }
  if ((pAig->pReprs == (Gia_Rpr_t *)0x0) || (pAig->pNexts == (int *)0x0)) {
    if (pAig->pCexSeq != (Abc_Cex_t *)0x0) {
      free(pAig->pCexSeq);
      pAig->pCexSeq = (Abc_Cex_t *)0x0;
    }
    local_40 = pAig;
    p = Gia_ManSimCreate(pAig,pPars);
    Gia_ManResetRandom(pPars);
    Gia_ManSimInfoInit(p);
    local_48 = lVar15;
    if (pPars->nIters < 1) {
      iFrame = 0;
    }
    else {
      local_38 = (double)lVar15;
      iFrame = 0;
      do {
        pGVar11 = p;
        Gia_ManSimulateRound(p);
        if (pPars->fVerbose != 0) {
          Abc_Print((int)pGVar11,"Frame %4d out of %4d and timeout %3d sec. ",(ulong)(iFrame + 1),
                    (ulong)(uint)pPars->nIters);
          iVar4 = 3;
          iVar3 = clock_gettime(3,&local_60);
          dVar16 = -1.0;
          if (-1 < iVar3) {
            dVar16 = (double)(local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000);
          }
          Abc_Print(iVar4,"Time = %7.2f sec\r",(dVar16 - local_38) / 1000000.0);
        }
        iVar3 = local_50;
        if (pPars->fCheckMiter != 0) {
          iVar4 = p->pAig->vCos->nSize;
          bVar2 = true;
          iVar10 = p->pAig->nRegs;
          uVar9 = iVar4 - iVar10;
          if (uVar9 != 0 && iVar10 <= iVar4) {
            puVar6 = p->pDataSimCos;
            uVar1 = p->nWords;
            uVar13 = 0;
LAB_00225580:
            iVar3 = -1;
            if (0 < (int)uVar1) {
              lVar15 = 0;
              puVar14 = puVar6;
              do {
                if (*puVar14 != 0) {
                  uVar7 = 0;
                  goto LAB_002255ab;
                }
                lVar15 = lVar15 + -0x20;
                puVar14 = puVar14 + 1;
              } while ((ulong)uVar1 * 0x20 + lVar15 != 0);
            }
            goto LAB_002255c0;
          }
LAB_002255dc:
          if (!bVar2) {
            Gia_ManResetRandom(pPars);
            pAig_00 = local_40;
            uVar9 = local_4c;
            pPars->iOutFail = local_4c;
            pGVar12 = local_40;
            pAVar5 = Gia_ManGenerateCounter(local_40,iFrame,local_4c,p->nWords,iVar3,p->vCis2Ids);
            pAig_00->pCexSeq = pAVar5;
            Abc_Print((int)pGVar12,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                      (ulong)uVar9,pAig_00->pName,(ulong)iFrame);
            iVar4 = Gia_ManVerifyCex(pAig_00,pAig_00->pCexSeq,0);
            iVar3 = 1;
            if (iVar4 == 0) {
              Abc_Print((int)pAig_00,"\nGenerated counter-example is INVALID.                    ");
            }
            goto LAB_00225661;
          }
        }
        local_50 = iVar3;
        iVar3 = clock_gettime(3,&local_60);
        if (iVar3 < 0) {
          lVar15 = -1;
        }
        else {
          lVar15 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
        }
        if (lVar8 < lVar15) {
          iFrame = iFrame + 1;
          break;
        }
        if ((int)iFrame < pPars->nIters + -1) {
          Gia_ManSimInfoTransfer(p);
        }
        iFrame = iFrame + 1;
      } while ((int)iFrame < pPars->nIters);
    }
    iVar3 = 0;
LAB_00225661:
    Gia_ManSimDelete(p);
    if (local_40->pCexSeq == (Abc_Cex_t *)0x0) {
      Abc_Print((int)p,"No bug detected after simulating %d frames with %d words.  ",(ulong)iFrame,
                (ulong)(uint)pPars->nWords);
    }
    iVar10 = 3;
    iVar4 = clock_gettime(3,&local_60);
    if (iVar4 < 0) {
      lVar15 = -1;
    }
    else {
      lVar15 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    lVar15 = lVar15 - local_48;
    Abc_Print(iVar10,"%s =","Time");
    Abc_Print(iVar10,"%9.2f sec\n",(double)lVar15 / 1000000.0);
  }
  else {
    iVar3 = Gia_ManSimSimulateEquiv(pAig,pPars);
  }
  return iVar3;
  while (uVar7 = uVar7 + 1, uVar7 != 0x20) {
LAB_002255ab:
    if ((*puVar14 >> (uVar7 & 0x1f) & 1) != 0) goto LAB_002255bd;
  }
  uVar7 = 0xffffffff;
LAB_002255bd:
  iVar3 = uVar7 - (int)lVar15;
LAB_002255c0:
  if (-1 < iVar3) {
    bVar2 = false;
    local_4c = (uint)uVar13;
    goto LAB_002255dc;
  }
  uVar13 = uVar13 + 1;
  puVar6 = puVar6 + (int)uVar1;
  iVar3 = local_50;
  if (uVar13 == uVar9) goto LAB_002255dc;
  goto LAB_00225580;
}

Assistant:

int Gia_ManSimSimulate( Gia_Man_t * pAig, Gia_ParSim_t * pPars )
{
    extern int Gia_ManSimSimulateEquiv( Gia_Man_t * pAig, Gia_ParSim_t * pPars );
    Gia_ManSim_t * p;
    abctime clkTotal = Abc_Clock();
    int i, iOut, iPat, RetValue = 0;
    abctime nTimeToStop = pPars->TimeLimit ? pPars->TimeLimit * CLOCKS_PER_SEC + Abc_Clock(): 0;
    if ( pAig->pReprs && pAig->pNexts )
        return Gia_ManSimSimulateEquiv( pAig, pPars );
    ABC_FREE( pAig->pCexSeq );
    p = Gia_ManSimCreate( pAig, pPars );
    Gia_ManResetRandom( pPars );
    Gia_ManSimInfoInit( p );
    for ( i = 0; i < pPars->nIters; i++ )
    {
        Gia_ManSimulateRound( p );
        if ( pPars->fVerbose )
        {
            Abc_Print( 1, "Frame %4d out of %4d and timeout %3d sec. ", i+1, pPars->nIters, pPars->TimeLimit );
            Abc_Print( 1, "Time = %7.2f sec\r", (1.0*Abc_Clock()-clkTotal)/CLOCKS_PER_SEC );
        }
        if ( pPars->fCheckMiter && Gia_ManCheckPos( p, &iOut, &iPat ) )
        {
            Gia_ManResetRandom( pPars );
            pPars->iOutFail = iOut;
            pAig->pCexSeq = Gia_ManGenerateCounter( pAig, i, iOut, p->nWords, iPat, p->vCis2Ids );
            Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", iOut, pAig->pName, i );
            if ( !Gia_ManVerifyCex( pAig, pAig->pCexSeq, 0 ) )
            {
//                Abc_Print( 1, "\n" );
                Abc_Print( 1, "\nGenerated counter-example is INVALID.                    " );
//                Abc_Print( 1, "\n" );
            }
            else
            {
//                Abc_Print( 1, "\n" );
//                if ( pPars->fVerbose )
//                Abc_Print( 1, "\nGenerated counter-example is verified correctly.         " );
//                Abc_Print( 1, "\n" );
            }
            RetValue = 1;
            break;
        }
        if ( Abc_Clock() > nTimeToStop )
        {
            i++;
            break;
        }
        if ( i < pPars->nIters - 1 )
            Gia_ManSimInfoTransfer( p );
    }
    Gia_ManSimDelete( p );
    if ( pAig->pCexSeq == NULL )
        Abc_Print( 1, "No bug detected after simulating %d frames with %d words.  ", i, pPars->nWords );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
    return RetValue;
}